

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

POLICYINFO * policy_section(X509V3_CTX *ctx,stack_st_CONF_VALUE *polstrs,int ia5org)

{
  ASN1_STRING *str;
  char *_data;
  int iVar1;
  POLICYINFO *a;
  CONF_VALUE *pCVar2;
  ASN1_OBJECT *pAVar3;
  stack_st_POLICYQUALINFO *psVar4;
  POLICYQUALINFO *p;
  size_t sVar5;
  ASN1_IA5STRING *pAVar6;
  size_t len_s;
  stack_st_CONF_VALUE *unot_00;
  POLICYQUALINFO *p_00;
  stack_st_CONF_VALUE *unot;
  ASN1_OBJECT *pobj;
  CONF_VALUE *cnf;
  size_t i;
  POLICYQUALINFO *qual;
  POLICYINFO *pol;
  int ia5org_local;
  stack_st_CONF_VALUE *polstrs_local;
  X509V3_CTX *ctx_local;
  
  a = POLICYINFO_new();
  if (a != (POLICYINFO *)0x0) {
    for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(polstrs), cnf < pCVar2;
        cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value(polstrs,(size_t)cnf);
      iVar1 = strcmp(pCVar2->name,"policyIdentifier");
      if (iVar1 == 0) {
        pAVar3 = OBJ_txt2obj(pCVar2->value,0);
        if (pAVar3 == (ASN1_OBJECT *)0x0) {
          ERR_put_error(0x14,0,0x81,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                        ,0xc2);
          ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                             pCVar2->value);
          goto LAB_002e635e;
        }
        a->policyid = pAVar3;
      }
      else {
        iVar1 = x509v3_conf_name_matches(pCVar2->name,"CPS");
        if (iVar1 == 0) {
          iVar1 = x509v3_conf_name_matches(pCVar2->name,"userNotice");
          if (iVar1 == 0) {
            ERR_put_error(0x14,0,0x82,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,0xf6);
            ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                               pCVar2->value);
            goto LAB_002e635e;
          }
          if (*pCVar2->value != '@') {
            ERR_put_error(0x14,0,0x6f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,0xe0);
            ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                               pCVar2->value);
            goto LAB_002e635e;
          }
          unot_00 = (stack_st_CONF_VALUE *)X509V3_get_section((X509V3_CTX *)ctx,pCVar2->value + 1);
          if (unot_00 == (stack_st_CONF_VALUE *)0x0) {
            ERR_put_error(0x14,0,0x86,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,0xe7);
            ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                               pCVar2->value);
            goto LAB_002e635e;
          }
          p_00 = notice_section(ctx,unot_00,ia5org);
          if (p_00 == (POLICYQUALINFO *)0x0) goto LAB_002e635e;
          if (a->qualifiers == (stack_st_POLICYQUALINFO *)0x0) {
            psVar4 = sk_POLICYQUALINFO_new_null();
            a->qualifiers = (stack_st_POLICYQUALINFO *)psVar4;
          }
          sVar5 = sk_POLICYQUALINFO_push((stack_st_POLICYQUALINFO *)a->qualifiers,p_00);
          if (sVar5 == 0) goto LAB_002e635e;
        }
        else {
          if (a->qualifiers == (stack_st_POLICYQUALINFO *)0x0) {
            psVar4 = sk_POLICYQUALINFO_new_null();
            a->qualifiers = (stack_st_POLICYQUALINFO *)psVar4;
          }
          p = POLICYQUALINFO_new();
          if ((p == (POLICYQUALINFO *)0x0) ||
             (sVar5 = sk_POLICYQUALINFO_push
                                ((stack_st_POLICYQUALINFO *)a->qualifiers,(POLICYQUALINFO *)p),
             sVar5 == 0)) goto LAB_002e635e;
          pAVar3 = OBJ_nid2obj(0xa4);
          p->pqualid = pAVar3;
          if (p->pqualid == (ASN1_OBJECT *)0x0) {
            ERR_put_error(0x14,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,0xd4);
            goto LAB_002e635e;
          }
          pAVar6 = ASN1_IA5STRING_new();
          (p->d).cpsuri = pAVar6;
          if ((p->d).cpsuri == (ASN1_IA5STRING *)0x0) goto LAB_002e635e;
          str = (ASN1_STRING *)(p->d).cpsuri;
          _data = pCVar2->value;
          len_s = strlen(pCVar2->value);
          iVar1 = ASN1_STRING_set(str,_data,len_s);
          if (iVar1 == 0) goto LAB_002e635e;
        }
      }
    }
    if (a->policyid != (ASN1_OBJECT *)0x0) {
      return (POLICYINFO *)a;
    }
    ERR_put_error(0x14,0,0x8e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                  ,0xfd);
  }
LAB_002e635e:
  POLICYINFO_free(a);
  return (POLICYINFO *)0x0;
}

Assistant:

static POLICYINFO *policy_section(const X509V3_CTX *ctx,
                                  const STACK_OF(CONF_VALUE) *polstrs,
                                  int ia5org) {
  POLICYINFO *pol;
  POLICYQUALINFO *qual;
  if (!(pol = POLICYINFO_new())) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(polstrs); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(polstrs, i);
    if (!strcmp(cnf->name, "policyIdentifier")) {
      ASN1_OBJECT *pobj;
      if (!(pobj = OBJ_txt2obj(cnf->value, 0))) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
        X509V3_conf_err(cnf);
        goto err;
      }
      pol->policyid = pobj;

    } else if (x509v3_conf_name_matches(cnf->name, "CPS")) {
      if (!pol->qualifiers) {
        pol->qualifiers = sk_POLICYQUALINFO_new_null();
      }
      if (!(qual = POLICYQUALINFO_new())) {
        goto err;
      }
      if (!sk_POLICYQUALINFO_push(pol->qualifiers, qual)) {
        goto err;
      }
      qual->pqualid = OBJ_nid2obj(NID_id_qt_cps);
      if (qual->pqualid == NULL) {
        OPENSSL_PUT_ERROR(X509V3, ERR_R_INTERNAL_ERROR);
        goto err;
      }
      qual->d.cpsuri = ASN1_IA5STRING_new();
      if (qual->d.cpsuri == NULL) {
        goto err;
      }
      if (!ASN1_STRING_set(qual->d.cpsuri, cnf->value, strlen(cnf->value))) {
        goto err;
      }
    } else if (x509v3_conf_name_matches(cnf->name, "userNotice")) {
      if (*cnf->value != '@') {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXPECTED_A_SECTION_NAME);
        X509V3_conf_err(cnf);
        goto err;
      }
      const STACK_OF(CONF_VALUE) *unot =
          X509V3_get_section(ctx, cnf->value + 1);
      if (!unot) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SECTION);
        X509V3_conf_err(cnf);
        goto err;
      }
      qual = notice_section(ctx, unot, ia5org);
      if (!qual) {
        goto err;
      }
      if (!pol->qualifiers) {
        pol->qualifiers = sk_POLICYQUALINFO_new_null();
      }
      if (!sk_POLICYQUALINFO_push(pol->qualifiers, qual)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OPTION);

      X509V3_conf_err(cnf);
      goto err;
    }
  }
  if (!pol->policyid) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_POLICY_IDENTIFIER);
    goto err;
  }

  return pol;

err:
  POLICYINFO_free(pol);
  return NULL;
}